

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O3

BuildKey * llbuild::buildsystem::BuildKey::fromData(BuildKey *__return_storage_ptr__,KeyType *key)

{
  pointer pcVar1;
  Kind KVar2;
  
  (__return_storage_ptr__->key).key._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->key).key.field_2;
  pcVar1 = (key->key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (key->key)._M_string_length);
  KVar2 = kindForIdentifier(*(__return_storage_ptr__->key).key._M_dataplus._M_p);
  if (KVar2 != Unknown) {
    return __return_storage_ptr__;
  }
  __assert_fail("result.getKind() != Kind::Unknown && \"invalid key\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,299,"static BuildKey llbuild::buildsystem::BuildKey::fromData(const KeyType &)");
}

Assistant:

static BuildKey fromData(const KeyType& key) {
    auto result = BuildKey(key);
    assert(result.getKind() != Kind::Unknown && "invalid key");
    return result;
  }